

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rebuildPage(MemPage *pPg,int nCell,u8 **apCell,u16 *szCell)

{
  ushort *puVar1;
  ushort *puVar2;
  u8 *puVar3;
  char *pcVar4;
  ushort *puVar5;
  int iVar6;
  ulong uVar7;
  ushort uVar8;
  long lVar9;
  ushort *__dest;
  ushort *__src;
  ulong uVar10;
  ulong uVar11;
  
  uVar7 = (ulong)pPg->hdrOffset;
  puVar2 = (ushort *)pPg->aData;
  lVar9 = (long)(int)pPg->pBt->usableSize;
  puVar1 = (ushort *)((long)puVar2 + lVar9);
  puVar3 = pPg->aCellIdx;
  pcVar4 = pPg->pBt->pPager->pTmpSpace;
  uVar8 = *(ushort *)((long)puVar2 + uVar7 + 5);
  uVar10 = (ulong)(ushort)(uVar8 << 8 | uVar8 >> 8);
  memcpy(pcVar4 + uVar10,(void *)(uVar10 + (long)puVar2),lVar9 - uVar10);
  uVar10 = 0;
  uVar11 = 0;
  __dest = puVar1;
  if (0 < nCell) {
    uVar11 = (ulong)(uint)nCell;
  }
  while( true ) {
    if (uVar11 == uVar10) {
      pPg->nCell = (u16)nCell;
      pPg->nOverflow = '\0';
      *(undefined2 *)((long)puVar2 + uVar7 + 1) = 0;
      *(undefined1 *)((long)puVar2 + uVar7 + 3) = *(undefined1 *)((long)&pPg->nCell + 1);
      *(char *)((long)puVar2 + uVar7 + 4) = (char)pPg->nCell;
      *(char *)((long)puVar2 + uVar7 + 5) = (char)((ulong)((long)__dest - (long)puVar2) >> 8);
      *(char *)((long)puVar2 + uVar7 + 6) = (char)((long)__dest - (long)puVar2);
      *(undefined1 *)((long)puVar2 + uVar7 + 7) = 0;
      return 0;
    }
    __dest = (ushort *)((long)__dest - (ulong)szCell[uVar10]);
    uVar8 = (short)__dest - (short)puVar2;
    puVar5 = (ushort *)apCell[uVar10];
    *(ushort *)(puVar3 + uVar10 * 2) = uVar8 * 0x100 | uVar8 >> 8;
    if (__dest < (ushort *)((long)(puVar3 + uVar10 * 2) + 2)) break;
    __src = (ushort *)((long)puVar5 + ((long)pcVar4 - (long)puVar2));
    if (puVar1 <= puVar5) {
      __src = puVar5;
    }
    if (puVar5 < puVar2) {
      __src = puVar5;
    }
    memcpy(__dest,__src,(ulong)szCell[uVar10]);
    uVar10 = uVar10 + 1;
  }
  iVar6 = sqlite3CorruptError(0xff50);
  return iVar6;
}

Assistant:

static int rebuildPage(
  MemPage *pPg,                   /* Edit this page */
  int nCell,                      /* Final number of cells on page */
  u8 **apCell,                    /* Array of cells */
  u16 *szCell                     /* Array of cell sizes */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i;
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;

  i = get2byte(&aData[hdr+5]);
  memcpy(&pTmp[i], &aData[i], usableSize - i);

  pData = pEnd;
  for(i=0; i<nCell; i++){
    u8 *pCell = apCell[i];
    if( SQLITE_WITHIN(pCell,aData,pEnd) ){
      pCell = &pTmp[pCell - aData];
    }
    pData -= szCell[i];
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    if( pData < pCellptr ) return SQLITE_CORRUPT_BKPT;
    memcpy(pData, pCell, szCell[i]);
    assert( szCell[i]==pPg->xCellSize(pPg, pCell) || CORRUPT_DB );
    testcase( szCell[i]!=pPg->xCellSize(pPg,pCell) );
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
  return SQLITE_OK;
}